

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O1

adt_error_t adt_ary_push(adt_ary_t *self,void *pElem)

{
  int iVar1;
  adt_error_t aVar2;
  
  if (self == (adt_ary_t *)0x0) {
    aVar2 = '\x01';
  }
  else {
    iVar1 = self->s32CurLen;
    if ((long)iVar1 == 0x7fffffff) {
      __assert_fail("self->s32CurLen < INT32_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ary.c"
                    ,0xaa,"adt_error_t adt_ary_push(adt_ary_t *, void *)");
    }
    aVar2 = adt_ary_extend(self,iVar1 + 1);
    if (aVar2 == '\0') {
      self->pFirst[iVar1] = pElem;
    }
  }
  return aVar2;
}

Assistant:

adt_error_t	adt_ary_push(adt_ary_t *self, void *pElem){
   if (self != 0) {
      int32_t s32Index;
      adt_error_t result;
      s32Index = self->s32CurLen;
      assert(self->s32CurLen < INT32_MAX);
      result = adt_ary_extend(self,((int32_t) s32Index+1));
      if (result == ADT_NO_ERROR) {
         self->pFirst[s32Index]=pElem;
      }
      return result;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}